

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void parse_tile_row_mt(AV1Decoder *pbi,ThreadData *td,TileDataDec *tile_data)

{
  uint uVar1;
  int num_planes_00;
  int iVar2;
  int mi_col_00;
  int iVar3;
  int *in_RDX;
  DecoderCodingBlock *in_RSI;
  AV1Decoder *in_RDI;
  int corrupted;
  int mi_col;
  int mi_row;
  MACROBLOCKD *xd;
  DecoderCodingBlock *dcb;
  int tile_row;
  TileInfo *tile_info;
  int num_planes;
  int sb_mi_size;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  DecoderCodingBlock *xd_00;
  AV1_COMMON *cm_00;
  
  cm_00 = &in_RDI->common;
  uVar1 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [((in_RDI->common).seq_params)->sb_size];
  num_planes_00 = av1_num_planes(cm_00);
  xd_00 = in_RSI;
  av1_zero_above_context
            (cm_00,(MACROBLOCKD *)CONCAT44(uVar1,num_planes_00),(int)((ulong)in_RDX >> 0x20),
             (int)in_RDX,in_RDX[4]);
  av1_reset_loop_filter_delta(&xd_00->xd,num_planes_00);
  av1_reset_loop_restoration
            ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c);
  iVar3 = *in_RDX;
  do {
    if (in_RDX[1] <= iVar3) {
      iVar3 = check_trailing_bits_after_symbol_coder((aom_reader *)xd_00);
      aom_merge_corrupted_flag(&in_RSI->corrupted,(uint)(iVar3 != 0));
      return;
    }
    av1_zero_left_context((MACROBLOCKD *)0x1d2123);
    for (mi_col_00 = in_RDX[2]; mi_col_00 < in_RDX[3];
        mi_col_00 = cm_00->seq_params->mib_size + mi_col_00) {
      set_cb_buffer(in_RDI,in_RSI,in_RDI->cb_buffer_base,num_planes_00,iVar3,mi_col_00);
      decode_partition((AV1Decoder *)tile_data,(ThreadData *)cm,sb_mi_size,num_planes,
                       (aom_reader *)tile_info,tile_row._3_1_,(int)pbi);
      iVar2 = aom_reader_has_overflowed
                        ((aom_reader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                        );
      if (iVar2 != 0) {
        aom_merge_corrupted_flag(&in_RSI->corrupted,1);
        return;
      }
    }
    signal_parse_sb_row_done
              ((AV1Decoder *)CONCAT44(iVar3,mi_col_00),
               (TileDataDec *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4);
    iVar3 = cm_00->seq_params->mib_size + iVar3;
  } while( true );
}

Assistant:

static inline void parse_tile_row_mt(AV1Decoder *pbi, ThreadData *const td,
                                     TileDataDec *const tile_data) {
  AV1_COMMON *const cm = &pbi->common;
  const int sb_mi_size = mi_size_wide[cm->seq_params->sb_size];
  const int num_planes = av1_num_planes(cm);
  const TileInfo *const tile_info = &tile_data->tile_info;
  int tile_row = tile_info->tile_row;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;

  av1_zero_above_context(cm, xd, tile_info->mi_col_start, tile_info->mi_col_end,
                         tile_row);
  av1_reset_loop_filter_delta(xd, num_planes);
  av1_reset_loop_restoration(xd, num_planes);

  for (int mi_row = tile_info->mi_row_start; mi_row < tile_info->mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    av1_zero_left_context(xd);

    for (int mi_col = tile_info->mi_col_start; mi_col < tile_info->mi_col_end;
         mi_col += cm->seq_params->mib_size) {
      set_cb_buffer(pbi, dcb, pbi->cb_buffer_base, num_planes, mi_row, mi_col);

      // Bit-stream parsing of the superblock
      decode_partition(pbi, td, mi_row, mi_col, td->bit_reader,
                       cm->seq_params->sb_size, 0x1);

      if (aom_reader_has_overflowed(td->bit_reader)) {
        aom_merge_corrupted_flag(&dcb->corrupted, 1);
        return;
      }
    }
    signal_parse_sb_row_done(pbi, tile_data, sb_mi_size);
  }

  int corrupted =
      (check_trailing_bits_after_symbol_coder(td->bit_reader)) ? 1 : 0;
  aom_merge_corrupted_flag(&dcb->corrupted, corrupted);
}